

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O0

TypePointer * __thiscall TypeFactory::getTypePointer(TypeFactory *this,int4 s,Datatype *pt,uint4 ws)

{
  type_metatype tVar1;
  TypePointer *pTVar2;
  undefined1 local_78 [8];
  TypePointer tmp;
  uint4 ws_local;
  Datatype *pt_local;
  int4 s_local;
  TypeFactory *this_local;
  
  tmp._76_4_ = ws;
  tVar1 = Datatype::getMetatype(pt);
  while (tVar1 == TYPE_ARRAY) {
    pt = TypeArray::getBase((TypeArray *)pt);
    tVar1 = Datatype::getMetatype(pt);
  }
  TypePointer::TypePointer((TypePointer *)local_78,s,pt,tmp._76_4_);
  pTVar2 = (TypePointer *)findAdd(this,(Datatype *)local_78);
  TypePointer::~TypePointer((TypePointer *)local_78);
  return pTVar2;
}

Assistant:

TypePointer *TypeFactory::getTypePointer(int4 s,Datatype *pt,uint4 ws)

{				// Create pointer to type -pt-
  if (pt->getMetatype() == TYPE_ARRAY) {
    // Do no allow pointers to array
    do {
      pt = ((TypeArray *)pt)->getBase();
    } while(pt->getMetatype() == TYPE_ARRAY);
  }
  TypePointer tmp(s,pt,ws);
  return (TypePointer *) findAdd(tmp);
}